

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

bool booster::locale::impl_icu::num_base::use_parent<unsigned_short>(ios_base *ios,unsigned_short v)

{
  bool bVar1;
  fmtflags __a;
  _Ios_Fmtflags _Var2;
  ios_info *this;
  uint64_t uVar3;
  unsigned_short in_SI;
  ios_base *in_RDI;
  uint64_t flg;
  bool local_1;
  
  this = ios_info::get((ios_base *)0x279e2b);
  uVar3 = ios_info::display_flags(this);
  if (uVar3 == 0) {
    local_1 = true;
  }
  else {
    bVar1 = details::use_parent_traits<unsigned_short,_false,_true,_false>::use(in_SI);
    if (bVar1) {
      local_1 = true;
    }
    else {
      if (uVar3 == 1) {
        __a = std::ios_base::flags(in_RDI);
        _Var2 = std::operator&(__a,_S_basefield);
        if (_Var2 != _S_dec) {
          return true;
        }
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

static bool use_parent(std::ios_base &ios,ValueType v)
    {
        uint64_t flg = ios_info::get(ios).display_flags();
        if(flg == flags::posix)
            return true;
        if(details::use_parent_traits<ValueType>::use(v))
            return true;

        if(!std::numeric_limits<ValueType>::is_integer)
            return false;

        if(flg == flags::number && (ios.flags() & std::ios_base::basefield) != std::ios_base::dec) {
            return true;
        }
        return false;
    }